

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **ppuVar1;
  size_t *outlen;
  uint8_t *private_key;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  BIGNUM *pBVar12;
  size_t sVar13;
  uchar *puVar14;
  uchar *puVar15;
  LIBSSH2_CRYPT_METHOD *pLVar16;
  _LIBSSH2_MAC_METHOD *p_Var17;
  LIBSSH2_COMP_METHOD *pLVar18;
  size_t sVar19;
  char *pcVar20;
  ulong uVar21;
  uchar *puVar22;
  EVP_MD_CTX *fingerprint_ctx;
  uchar *server_public_key;
  uint local_94;
  uchar *server_host_key;
  uint local_84;
  uchar *local_80;
  void **local_78;
  size_t server_public_key_len;
  uchar *s;
  uchar *local_60;
  ulong local_58;
  kmdhgGPshakex_state_t *local_50;
  uchar **local_48;
  size_t *local_40;
  size_t hostkey_len;
  
  iVar5 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    goto switchD_0010f945_caseD_0;
  default:
    goto switchD_0010f945_caseD_1;
  case libssh2_NB_state_created:
    goto switchD_0010f945_caseD_2;
  case libssh2_NB_state_sent:
    sVar19 = key_state->request_len;
    goto LAB_0010fa11;
  case libssh2_NB_state_sent1:
    goto switchD_0010f945_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_0010f945_caseD_5;
  }
LAB_001106f8:
  (*session->free)(puVar15,&session->abstract);
LAB_00110705:
  (*session->free)(puVar14,&session->abstract);
LAB_0011070c:
  iVar5 = -5;
  goto switchD_0010fae3_caseD_1;
switchD_0010f945_caseD_0:
  key_state->public_key_oct = (uchar *)0x0;
  key_state->state = libssh2_NB_state_created;
switchD_0010f945_caseD_2:
  s = (uchar *)0x0;
  pcVar20 = session->kex->name;
  iVar5 = strcmp(pcVar20,"curve25519-sha256@libssh.org");
  if ((iVar5 != 0) && (iVar5 = strcmp(pcVar20,"curve25519-sha256"), iVar5 != 0)) {
    pcVar20 = "Unknown KEX curve25519 curve type";
    iVar5 = -1;
LAB_0010fb50:
    iVar5 = _libssh2_error(session,iVar5,pcVar20);
    goto switchD_0010f945_caseD_1;
  }
  iVar5 = _libssh2_curve25519_new
                    (session,&key_state->curve25519_public_key,&key_state->curve25519_private_key);
  if (iVar5 != 0) {
    pcVar20 = "Unable to create private key";
    goto LAB_0010fb50;
  }
  key_state->request[0] = '\x1e';
  s = key_state->request + 1;
  _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
  key_state->request_len = 0x25;
  key_state->state = libssh2_NB_state_sent;
  sVar19 = 0x25;
LAB_0010fa11:
  iVar5 = _libssh2_transport_send(session,key_state->request,sVar19,(uchar *)0x0,0);
  if (iVar5 == -0x25) {
    return -0x25;
  }
  if (iVar5 != 0) {
    pcVar20 = "Unable to send ECDH_INIT";
    goto LAB_0010fb50;
  }
  key_state->state = libssh2_NB_state_sent1;
switchD_0010f945_caseD_4:
  iVar5 = _libssh2_packet_require
                    (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                     &key_state->req_state);
  if (iVar5 == -0x25) {
    return -0x25;
  }
  if (iVar5 != 0) {
    pcVar20 = "Timeout waiting for ECDH_REPLY reply";
    goto LAB_0010fb50;
  }
  key_state->state = libssh2_NB_state_sent2;
switchD_0010f945_caseD_5:
  uVar21 = key_state->data_len;
  if (uVar21 < 5) {
    iVar5 = _libssh2_error(session,-10,"Data is too short");
  }
  else {
    local_50 = &key_state->exchange_state;
    iVar5 = 0;
    if (libssh2_NB_state_sent2 < local_50->state) goto switchD_0010fae3_caseD_1;
    puVar14 = key_state->data;
    puVar15 = key_state->curve25519_public_key;
    private_key = key_state->curve25519_private_key;
    switch(local_50->state) {
    case libssh2_NB_state_idle:
      pBVar12 = BN_new();
      (key_state->exchange_state).k = (BIGNUM *)pBVar12;
      (key_state->exchange_state).state = libssh2_NB_state_created;
      break;
    default:
      goto switchD_0010fae3_caseD_1;
    case libssh2_NB_state_created:
      break;
    case libssh2_NB_state_sent:
      goto switchD_0010fae3_caseD_3;
    case libssh2_NB_state_sent2:
      goto switchD_0010fae3_caseD_5;
    }
    local_60 = puVar14 + 1;
    s = puVar14;
    local_58 = uVar21;
    iVar5 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
    if (iVar5 != 0) {
      pcVar20 = "Unexpected curve25519 key length 2";
LAB_0010fb2e:
      iVar5 = -0xe;
      goto LAB_0011069d;
    }
    session->server_hostkey_len = (uint32_t)hostkey_len;
    puVar14 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
    session->server_hostkey = puVar14;
    if (puVar14 == (uchar *)0x0) {
      pcVar20 = "Unable to allocate memory for a copy of the host curve25519 key";
LAB_0010fc68:
      iVar5 = -6;
      goto LAB_0011069d;
    }
    memcpy(puVar14,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
           (ulong)session->server_hostkey_len);
    iVar5 = _libssh2_sha1_init(&fingerprint_ctx);
    if ((iVar5 == 0) ||
       (iVar5 = _libssh2_sha1_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar5 == 0)) {
LAB_0010fbd4:
      iVar11 = 0;
    }
    else {
      iVar5 = _libssh2_sha1_final(&fingerprint_ctx,session->server_hostkey_sha1);
      iVar11 = 1;
      if (iVar5 == 0) goto LAB_0010fbd4;
    }
    session->server_hostkey_sha1_valid = iVar11;
    iVar5 = _libssh2_sha256_init(&fingerprint_ctx);
    if ((iVar5 == 0) ||
       (iVar5 = _libssh2_sha256_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar5 == 0)) {
LAB_0010fc1b:
      iVar11 = 0;
    }
    else {
      iVar5 = _libssh2_sha256_final(&fingerprint_ctx,session->server_hostkey_sha256);
      iVar11 = 1;
      if (iVar5 == 0) goto LAB_0010fc1b;
    }
    session->server_hostkey_sha256_valid = iVar11;
    iVar5 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                       &session->server_hostkey_abstract);
    if (iVar5 != 0) {
      pcVar20 = "Unable to initialize hostkey importer curve25519";
      goto LAB_0010fc54;
    }
    iVar5 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
    if (iVar5 != 0) {
      pcVar20 = "Unexpected curve25519 key length";
      goto LAB_0010fb2e;
    }
    if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
      ppuVar1 = &(key_state->exchange_state).h_sig;
      outlen = &(key_state->exchange_state).h_sig_len;
      local_78 = &session->server_hostkey_abstract;
      iVar5 = _libssh2_get_string((string_buf *)&s,ppuVar1,outlen);
      if (iVar5 != 0) {
        pcVar20 = "Unexpected curve25519 server sig length";
        goto LAB_0010fc54;
      }
      local_40 = outlen;
      iVar5 = _libssh2_curve25519_gen_k
                        (&(key_state->exchange_state).k,private_key,
                         (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
      if (iVar5 != 0) {
        pcVar20 = "Unable to create curve25519 shared secret";
        iVar5 = -5;
        goto LAB_0011069d;
      }
      local_48 = ppuVar1;
      iVar11 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      iVar5 = iVar11 + 0xe;
      if (-1 < iVar11 + 7) {
        iVar5 = iVar11 + 7;
      }
      (key_state->exchange_state).k_value_len = (long)((iVar5 >> 3) + 5);
      uVar6 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      sVar19 = (key_state->exchange_state).k_value_len;
      if ((uVar6 & 7) != 0) {
        sVar19 = sVar19 - 1;
        (key_state->exchange_state).k_value_len = sVar19;
      }
      puVar14 = (uchar *)(*session->alloc)(sVar19,&session->abstract);
      (key_state->exchange_state).k_value = puVar14;
      if (puVar14 == (uchar *)0x0) {
        pcVar20 = "Unable to allocate buffer for K";
        goto LAB_0010fc68;
      }
      _libssh2_htonu32(puVar14,(int)(key_state->exchange_state).k_value_len - 4);
      uVar6 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      if ((uVar6 & 7) == 0) {
        (key_state->exchange_state).k_value[4] = '\0';
        pBVar12 = (BIGNUM *)(key_state->exchange_state).k;
        puVar14 = (key_state->exchange_state).k_value + 5;
      }
      else {
        pBVar12 = (BIGNUM *)(key_state->exchange_state).k;
        puVar14 = (key_state->exchange_state).k_value + 4;
      }
      iVar5 = BN_bn2bin(pBVar12,puVar14);
      if (iVar5 < 1) {
        pcVar20 = "Can\'t write exchange_state->e";
        iVar5 = -0x29;
        goto LAB_0011069d;
      }
      iVar5 = _libssh2_sha256_init(&fingerprint_ctx);
      if (iVar5 == 0) {
LAB_001100a7:
        pcVar20 = "Unable to verify hostkey signature curve25519";
        iVar5 = -0xb;
        goto LAB_0011069d;
      }
      (key_state->exchange_state).exchange_hash = &fingerprint_ctx;
      puVar22 = (session->local).banner;
      puVar14 = (key_state->exchange_state).h_sig_comp;
      local_80 = puVar14;
      if (puVar22 == (uchar *)0x0) {
        _libssh2_htonu32(puVar14,0x1a);
        uVar6 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
        local_94 = _libssh2_sha256_update(&fingerprint_ctx,"SSH-2.0-libssh2_1.11.2_DEV",0x1a);
        local_94 = local_94 & uVar6;
      }
      else {
        sVar13 = strlen((char *)puVar22);
        puVar14 = local_80;
        _libssh2_htonu32(local_80,(int)sVar13 - 2);
        uVar6 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
        puVar14 = (session->local).banner;
        sVar13 = strlen((char *)puVar14);
        local_94 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,sVar13 - 2);
        local_94 = local_94 & uVar6;
      }
      local_94 = local_94 & 1;
      sVar13 = strlen((char *)(session->remote).banner);
      puVar22 = local_80;
      _libssh2_htonu32(local_80,(uint32_t)sVar13);
      local_84 = _libssh2_sha256_update(&fingerprint_ctx,puVar22,4);
      puVar14 = (session->remote).banner;
      sVar13 = strlen((char *)puVar14);
      uVar6 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,sVar13);
      uVar6 = uVar6 & local_84;
      _libssh2_htonu32(puVar22,(uint32_t)(session->local).kexinit_len);
      uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar22,4);
      uVar8 = _libssh2_sha256_update
                        (&fingerprint_ctx,(session->local).kexinit,(session->local).kexinit_len);
      local_94 = uVar8 & uVar7 & uVar6 & local_94;
      _libssh2_htonu32(puVar22,(uint32_t)(session->remote).kexinit_len);
      local_84 = _libssh2_sha256_update(&fingerprint_ctx,puVar22,4);
      uVar6 = _libssh2_sha256_update
                        (&fingerprint_ctx,(session->remote).kexinit,(session->remote).kexinit_len);
      uVar6 = uVar6 & local_84;
      _libssh2_htonu32(puVar22,session->server_hostkey_len);
      uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar22,4);
      uVar8 = _libssh2_sha256_update
                        (&fingerprint_ctx,session->server_hostkey,(ulong)session->server_hostkey_len
                        );
      _libssh2_htonu32(puVar22,0x20);
      uVar9 = _libssh2_sha256_update(&fingerprint_ctx,puVar22,4);
      uVar10 = _libssh2_sha256_update(&fingerprint_ctx,puVar15,0x20);
      puVar14 = local_80;
      uVar9 = uVar10 & uVar9 & uVar8 & uVar7 & uVar6 & local_94;
      _libssh2_htonu32(local_80,(uint32_t)server_public_key_len);
      uVar6 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
      uVar7 = _libssh2_sha256_update
                        (&fingerprint_ctx,
                         (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
      uVar8 = _libssh2_sha256_update
                        (&fingerprint_ctx,(key_state->exchange_state).k_value,
                         (key_state->exchange_state).k_value_len);
      if ((((uVar7 & uVar6 & uVar9 & uVar8) == 0) ||
          (iVar5 = _libssh2_sha256_final(&fingerprint_ctx,local_80), iVar5 == 0)) ||
         (iVar5 = (*session->hostkey->sig_verify)
                            (session,*local_48,*local_40,local_80,0x20,local_78), iVar5 != 0))
      goto LAB_001100a7;
      (key_state->exchange_state).c = '\x15';
      (key_state->exchange_state).state = libssh2_NB_state_sent;
switchD_0010fae3_caseD_3:
      iVar5 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
      if (iVar5 == -0x25) {
        return -0x25;
      }
      if (iVar5 != 0) {
        pcVar20 = "Unable to send NEWKEYS message curve25519";
        goto LAB_0011069d;
      }
      local_50->state = libssh2_NB_state_sent2;
switchD_0010fae3_caseD_5:
      ppuVar1 = &(key_state->exchange_state).tmp;
      iVar5 = _libssh2_packet_require
                        (session,'\x15',ppuVar1,&(key_state->exchange_state).tmp_len,0,(uchar *)0x0,
                         0,&(key_state->exchange_state).req_state);
      if (iVar5 == -0x25) {
        return -0x25;
      }
      if (iVar5 != 0) {
        pcVar20 = "Timed out waiting for NEWKEYS curve25519";
        goto LAB_0011069d;
      }
      *(byte *)&session->state = (byte)session->state | 4;
      (*session->free)(*ppuVar1,&session->abstract);
      if (session->session_id == (uchar *)0x0) {
        puVar14 = (uchar *)(*session->alloc)(0x20,&session->abstract);
        session->session_id = puVar14;
        if (puVar14 == (uchar *)0x0) {
          pcVar20 = "Unable to allocate buffer for SHA digest";
          goto LAB_0010fc68;
        }
        uVar2 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
        uVar3 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
        uVar4 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
        *(undefined8 *)(puVar14 + 0x10) =
             *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
        *(undefined8 *)(puVar14 + 0x18) = uVar4;
        *(undefined8 *)puVar14 = uVar2;
        *(undefined8 *)(puVar14 + 8) = uVar3;
        session->session_id_len = 0x20;
      }
      pLVar16 = (session->local).crypt;
      if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar16->dtor)(session,&(session->local).crypt_abstract);
        pLVar16 = (session->local).crypt;
      }
      if (pLVar16->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        server_public_key._0_4_ = 0;
        server_host_key._0_4_ = 0;
        puVar14 = (uchar *)(*session->alloc)((long)pLVar16->iv_len + 0x20,&session->abstract);
        if (puVar14 == (uchar *)0x0) {
LAB_001106e4:
          iVar5 = -1;
          goto switchD_0010fae3_caseD_1;
        }
        pLVar16 = (session->local).crypt;
        if (pLVar16->iv_len != 0) {
          sVar19 = 0;
          do {
            iVar5 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar5 == 0) ||
                (iVar5 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar5 == 0)) ||
               (iVar5 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar5 == 0)) {
LAB_001106da:
              (*session->free)(puVar14,&session->abstract);
              goto LAB_001106e4;
            }
            uVar21 = sVar19;
            puVar15 = puVar14;
            if (sVar19 == 0) {
              iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"A",1);
              if (iVar5 == 0) goto LAB_001106da;
              uVar21 = (ulong)session->session_id_len;
              puVar15 = session->session_id;
            }
            iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar15,uVar21);
            if ((iVar5 == 0) ||
               (iVar5 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar14 + sVar19), iVar5 == 0))
            goto LAB_001106da;
            sVar19 = sVar19 + 0x20;
            pLVar16 = (session->local).crypt;
          } while (sVar19 < (ulong)(long)pLVar16->iv_len);
        }
        puVar15 = (uchar *)(*session->alloc)((long)pLVar16->secret_len + 0x20,&session->abstract);
        if (puVar15 == (uchar *)0x0) goto LAB_00110705;
        pLVar16 = (session->local).crypt;
        if (pLVar16->secret_len != 0) {
          local_78 = (void **)(key_state->exchange_state).h_sig_comp;
          sVar19 = 0;
          do {
            iVar5 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar5 == 0) ||
                (iVar5 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar5 == 0)) ||
               (iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_78,0x20), iVar5 == 0))
            goto LAB_001106f8;
            uVar21 = sVar19;
            puVar22 = puVar15;
            if (sVar19 == 0) {
              iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"C",1);
              if (iVar5 == 0) goto LAB_001106f8;
              uVar21 = (ulong)session->session_id_len;
              puVar22 = session->session_id;
            }
            iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar22,uVar21);
            if ((iVar5 == 0) ||
               (iVar5 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar15 + sVar19), iVar5 == 0))
            goto LAB_001106f8;
            sVar19 = sVar19 + 0x20;
            pLVar16 = (session->local).crypt;
          } while (sVar19 < (ulong)(long)pLVar16->secret_len);
        }
        iVar5 = (*pLVar16->init)(session,pLVar16,puVar14,(int *)&server_public_key,puVar15,
                                 (int *)&server_host_key,1,&(session->local).crypt_abstract);
        puVar22 = puVar14;
        if (iVar5 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar14,(long)((session->local).crypt)->iv_len);
            (*session->free)(puVar14,&session->abstract);
          }
          if ((int)server_host_key != 0) {
            explicit_bzero(puVar15,(long)((session->local).crypt)->secret_len);
            (*session->free)(puVar15,&session->abstract);
          }
          goto LAB_00110426;
        }
LAB_00110679:
        puVar14 = puVar15;
        (*session->free)(puVar22,&session->abstract);
        goto LAB_00110705;
      }
LAB_00110426:
      pLVar16 = (session->remote).crypt;
      if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar16->dtor)(session,&(session->remote).crypt_abstract);
        pLVar16 = (session->remote).crypt;
      }
      if (pLVar16->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        server_public_key._0_4_ = 0;
        server_host_key._0_4_ = 0;
        puVar14 = (uchar *)(*session->alloc)((long)pLVar16->iv_len + 0x20,&session->abstract);
        if (puVar14 == (uchar *)0x0) goto LAB_0011070c;
        pLVar16 = (session->remote).crypt;
        if (pLVar16->iv_len != 0) {
          sVar19 = 0;
          do {
            iVar5 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar5 == 0) ||
                (iVar5 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar5 == 0)) ||
               (iVar5 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar5 == 0)) goto LAB_00110705;
            uVar21 = sVar19;
            puVar15 = puVar14;
            if (sVar19 == 0) {
              iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"B",1);
              if (iVar5 == 0) goto LAB_00110705;
              uVar21 = (ulong)session->session_id_len;
              puVar15 = session->session_id;
            }
            iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar15,uVar21);
            if ((iVar5 == 0) ||
               (iVar5 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar14 + sVar19), iVar5 == 0))
            goto LAB_00110705;
            sVar19 = sVar19 + 0x20;
            pLVar16 = (session->remote).crypt;
          } while (sVar19 < (ulong)(long)pLVar16->iv_len);
        }
        puVar15 = (uchar *)(*session->alloc)((long)pLVar16->secret_len + 0x20,&session->abstract);
        if (puVar15 == (uchar *)0x0) goto LAB_00110705;
        pLVar16 = (session->remote).crypt;
        if (pLVar16->secret_len != 0) {
          local_78 = (void **)(key_state->exchange_state).h_sig_comp;
          sVar19 = 0;
          do {
            iVar5 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar5 == 0) ||
                (iVar5 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar5 == 0)) ||
               (iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_78,0x20), iVar5 == 0))
            goto LAB_001106f8;
            uVar21 = sVar19;
            puVar22 = puVar15;
            if (sVar19 == 0) {
              iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"D",1);
              if (iVar5 == 0) goto LAB_001106f8;
              uVar21 = (ulong)session->session_id_len;
              puVar22 = session->session_id;
            }
            iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar22,uVar21);
            if ((iVar5 == 0) ||
               (iVar5 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar15 + sVar19), iVar5 == 0))
            goto LAB_001106f8;
            sVar19 = sVar19 + 0x20;
            pLVar16 = (session->remote).crypt;
          } while (sVar19 < (ulong)(long)pLVar16->secret_len);
        }
        iVar5 = (*pLVar16->init)(session,pLVar16,puVar14,(int *)&server_public_key,puVar15,
                                 (int *)&server_host_key,0,&(session->remote).crypt_abstract);
        puVar22 = puVar14;
        if (iVar5 != 0) goto LAB_00110679;
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar14,(long)((session->remote).crypt)->iv_len);
          (*session->free)(puVar14,&session->abstract);
        }
        if ((int)server_host_key != 0) {
          explicit_bzero(puVar15,(long)((session->remote).crypt)->secret_len);
          (*session->free)(puVar15,&session->abstract);
        }
      }
      p_Var17 = (session->local).mac;
      if (p_Var17->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var17->dtor)(session,&(session->local).mac_abstract);
        p_Var17 = (session->local).mac;
      }
      if (p_Var17->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        server_public_key._0_4_ = 0;
        puVar14 = (uchar *)(*session->alloc)((long)p_Var17->key_len + 0x20,&session->abstract);
        if (puVar14 == (uchar *)0x0) goto LAB_0011070c;
        p_Var17 = (session->local).mac;
        if (p_Var17->key_len != 0) {
          sVar19 = 0;
          do {
            iVar5 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar5 == 0) ||
                (iVar5 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar5 == 0)) ||
               (iVar5 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar5 == 0)) goto LAB_00110705;
            uVar21 = sVar19;
            puVar15 = puVar14;
            if (sVar19 == 0) {
              iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"E",1);
              if (iVar5 == 0) goto LAB_00110705;
              uVar21 = (ulong)session->session_id_len;
              puVar15 = session->session_id;
            }
            iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar15,uVar21);
            if ((iVar5 == 0) ||
               (iVar5 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar14 + sVar19), iVar5 == 0))
            goto LAB_00110705;
            sVar19 = sVar19 + 0x20;
            p_Var17 = (session->local).mac;
          } while (sVar19 < (ulong)(long)p_Var17->key_len);
        }
        (*p_Var17->init)(session,puVar14,(int *)&server_public_key,&(session->local).mac_abstract);
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar14,(long)((session->local).mac)->key_len);
          (*session->free)(puVar14,&session->abstract);
        }
      }
      p_Var17 = (session->remote).mac;
      if (p_Var17->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var17->dtor)(session,&(session->remote).mac_abstract);
        p_Var17 = (session->remote).mac;
      }
      if (p_Var17->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        server_public_key._0_4_ = 0;
        puVar14 = (uchar *)(*session->alloc)((long)p_Var17->key_len + 0x20,&session->abstract);
        if (puVar14 == (uchar *)0x0) goto LAB_0011070c;
        p_Var17 = (session->remote).mac;
        if (p_Var17->key_len != 0) {
          sVar19 = 0;
          do {
            iVar5 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar5 == 0) ||
                (iVar5 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar5 == 0)) ||
               (iVar5 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar5 == 0)) goto LAB_00110705;
            uVar21 = sVar19;
            puVar15 = puVar14;
            if (sVar19 == 0) {
              iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"F",1);
              if (iVar5 == 0) goto LAB_00110705;
              uVar21 = (ulong)session->session_id_len;
              puVar15 = session->session_id;
            }
            iVar5 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar15,uVar21);
            if ((iVar5 == 0) ||
               (iVar5 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar14 + sVar19), iVar5 == 0))
            goto LAB_00110705;
            sVar19 = sVar19 + 0x20;
            p_Var17 = (session->remote).mac;
          } while (sVar19 < (ulong)(long)p_Var17->key_len);
        }
        (*p_Var17->init)(session,puVar14,(int *)&server_public_key,&(session->remote).mac_abstract);
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar14,(long)((session->remote).mac)->key_len);
          (*session->free)(puVar14,&session->abstract);
        }
      }
      pLVar18 = (session->local).comp;
      if (pLVar18 != (LIBSSH2_COMP_METHOD *)0x0) {
        if (pLVar18->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          (*pLVar18->dtor)(session,1,&(session->local).comp_abstract);
          pLVar18 = (session->local).comp;
          if (pLVar18 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_00110a80;
        }
        if (pLVar18->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar11 = (*pLVar18->init)(session,1,&(session->local).comp_abstract);
          iVar5 = -5;
          if (iVar11 != 0) goto switchD_0010fae3_caseD_1;
        }
      }
LAB_00110a80:
      pLVar18 = (session->remote).comp;
      iVar5 = 0;
      if (pLVar18 != (LIBSSH2_COMP_METHOD *)0x0) {
        if (pLVar18->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar5 = 0;
          (*pLVar18->dtor)(session,0,&(session->remote).comp_abstract);
          pLVar18 = (session->remote).comp;
          if (pLVar18 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_0010fae3_caseD_1;
        }
        iVar5 = 0;
        if (pLVar18->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar5 = (*pLVar18->init)(session,0,&(session->remote).comp_abstract);
          iVar5 = (uint)(iVar5 == 0) * 5 + -5;
        }
      }
    }
    else {
      pcVar20 = "Unexpected curve25519 server public key length";
LAB_0010fc54:
      iVar5 = -10;
LAB_0011069d:
      iVar5 = _libssh2_error(session,iVar5,pcVar20);
    }
switchD_0010fae3_caseD_1:
    curve25519_exchange_state_cleanup(session,local_50);
  }
  if (iVar5 == -0x25) {
    return -0x25;
  }
switchD_0010f945_caseD_1:
  kex_method_curve25519_cleanup(session,key_state);
  return iVar5;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }
    }

clean_exit:

    kex_method_curve25519_cleanup(session, key_state);

    return ret;
}